

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

char32_t plot::detail::utf8_cp<char_const*>(char *it,char *end)

{
  byte first;
  bool local_29;
  int local_28;
  char32_t local_24;
  int len;
  char32_t cp;
  char *end_local;
  char *it_local;
  
  first = *it;
  local_28 = utf8_seq_length(first);
  if (local_28 == 0) {
    it_local._4_4_ = std::numeric_limits<char32_t>::max();
  }
  else {
    local_24 = (char32_t)(first & *(byte *)((long)&utf8_start_masks + (long)local_28));
    end_local = it;
    while( true ) {
      local_28 = local_28 + -1;
      local_29 = false;
      if ((0 < local_28) && (local_29 = false, end_local != end)) {
        local_29 = utf8_seq_cont(end_local[1]);
        end_local = end_local + 1;
      }
      if (local_29 == false) break;
      local_24 = local_24 << 6 | (byte)*end_local & 0x3f;
    }
    while (local_28 = local_28 + -1, 0 < local_28) {
      local_24 = local_24 << 6;
    }
    it_local._4_4_ = local_24;
  }
  return it_local._4_4_;
}

Assistant:

inline char32_t utf8_cp(Iterator it, Iterator end) {
        char32_t cp = static_cast<std::uint8_t>(*it);
        auto len = utf8_seq_length(cp);

        if (!len)
            return std::numeric_limits<char32_t>::max();

        cp = (cp & utf8_start_masks[len]);

        while (--len > 0 && it != end && utf8_seq_cont(*++it))
            cp = (cp << 6) | (static_cast<std::uint8_t>(*it) & utf8_cont_mask);

        while (--len > 0)
            cp <<= 6;

        return cp;
    }